

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

wchar_t find_cab_magic(char *p)

{
  char cVar1;
  wchar_t wVar2;
  
  cVar1 = p[4];
  if (cVar1 == 'S') {
    wVar2 = L'\x03';
  }
  else if (cVar1 == 'C') {
    wVar2 = L'\x02';
  }
  else if (cVar1 == 'F') {
    wVar2 = L'\x01';
  }
  else if (cVar1 == 'M') {
    wVar2 = L'\x04';
  }
  else {
    if (cVar1 == '\0') {
      return (uint)(*(long *)p != 0x4643534d) * 5;
    }
    wVar2 = L'\x05';
  }
  return wVar2;
}

Assistant:

static int
find_cab_magic(const char *p)
{
	switch (p[4]) {
	case 0:
		/*
		 * Note: Self-Extraction program has 'MSCF' string in their
		 * program. If we were finding 'MSCF' string only, we got
		 * wrong place for Cabinet header, thus, we have to check
		 * following four bytes which are reserved and must be set
		 * to zero.
		 */
		if (memcmp(p, "MSCF\0\0\0\0", 8) == 0)
			return 0;
		return 5;
	case 'F': return 1;
	case 'C': return 2;
	case 'S': return 3;
	case 'M': return 4;
	default:  return 5;
	}
}